

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSearch.cpp
# Opt level: O0

void __thiscall HighsSearch::currentNodeToQueue(HighsSearch *this,HighsNodeQueue *nodequeue)

{
  byte bVar1;
  HighsInt HVar2;
  vector<int,_std::allocator<int>_> *this_00;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *domchgs;
  reference pvVar3;
  double *pdVar4;
  pointer pHVar5;
  HighsNodeQueue *in_RSI;
  HighsConflictPool *in_RDI;
  double dVar6;
  HighsDomain *unaff_retaddr;
  double tmpTreeWeight;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> domchgStack;
  vector<int,_std::allocator<int>_> branchPositions;
  bool prune;
  size_type oldchangedcols;
  HighsDomain *in_stack_000001c8;
  HighsDomain *in_stack_ffffffffffffff28;
  HighsSearch *in_stack_ffffffffffffff30;
  double in_stack_ffffffffffffff38;
  double dVar7;
  HighsDomain *in_stack_ffffffffffffff40;
  HighsCDouble *this_01;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff90;
  HighsDomain *in_stack_ffffffffffffff98;
  HighsInt in_stack_ffffffffffffffcc;
  double in_stack_ffffffffffffffd0;
  double in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  HighsConflictPool *conflictPool;
  
  conflictPool = in_RDI;
  this_00 = HighsDomain::getChangedCols
                      ((HighsDomain *)
                       &(in_RDI->ageDistribution_).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_finish);
  domchgs = (vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)
            std::vector<int,_std::allocator<int>_>::size(this_00);
  pvVar3 = std::vector<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>::back
                     ((vector<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_> *)
                      in_stack_ffffffffffffff30);
  dVar7 = pvVar3->lower_bound;
  dVar6 = getCutoffBound(in_stack_ffffffffffffff30);
  bVar1 = dVar6 < dVar7;
  if (!(bool)bVar1) {
    HighsDomain::propagate(in_stack_000001c8);
    HighsDomain::clearChangedCols
              (in_stack_ffffffffffffff40,(HighsInt)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    bVar1 = HighsDomain::infeasible
                      ((HighsDomain *)
                       &(in_RDI->ageDistribution_).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_finish);
    if ((bool)bVar1) {
      std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                 0x69479c);
      HighsDomain::conflictAnalysis(unaff_retaddr,conflictPool);
    }
  }
  if ((bVar1 & 1) == 0) {
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x6947d2);
    HighsDomain::getReducedDomainChangeStack(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    pvVar3 = std::vector<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>::back
                       ((vector<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_> *)
                        in_stack_ffffffffffffff30);
    HighsDomain::getObjectiveLowerBound(in_stack_ffffffffffffff28);
    pdVar4 = std::max<double>(&pvVar3->lower_bound,(double *)&stack0xffffffffffffff90);
    dVar7 = *pdVar4;
    pvVar3 = std::vector<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>::back
                       ((vector<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_> *)
                        in_stack_ffffffffffffff30);
    this_01 = (HighsCDouble *)pvVar3->estimate;
    getCurrentDepth(in_stack_ffffffffffffff30);
    in_stack_ffffffffffffff30 =
         (HighsSearch *)
         HighsNodeQueue::emplaceNode
                   (in_RSI,domchgs,
                    (vector<int,_std::allocator<int>_> *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                    in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    if (((ulong)in_RDI[4].modification_.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish & 0x1000000000000) != 0) {
      HighsCDouble::operator+=(this_01,dVar7);
    }
    std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::~vector
              ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)this_01);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_01);
  }
  else {
    pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x694961);
    HighsDebugSol::nodePruned
              ((HighsDebugSol *)&pHVar5->field_0x68b0,
               (HighsDomain *)
               &(in_RDI->ageDistribution_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish);
    if (((ulong)in_RDI[4].modification_.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish & 0x1000000000000) != 0) {
      HVar2 = getCurrentDepth(in_stack_ffffffffffffff30);
      ldexp(1.0,1 - HVar2);
      HighsCDouble::operator+=((HighsCDouble *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    }
  }
  pvVar3 = std::vector<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>::back
                     ((vector<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_> *)
                      in_stack_ffffffffffffff30);
  pvVar3->opensubtrees = '\0';
  return;
}

Assistant:

void HighsSearch::currentNodeToQueue(HighsNodeQueue& nodequeue) {
  auto oldchangedcols = localdom.getChangedCols().size();
  bool prune = nodestack.back().lower_bound > getCutoffBound();
  if (!prune) {
    localdom.propagate();
    localdom.clearChangedCols(oldchangedcols);
    prune = localdom.infeasible();
    if (prune) localdom.conflictAnalysis(mipsolver.mipdata_->conflictPool);
  }
  if (!prune) {
    std::vector<HighsInt> branchPositions;
    auto domchgStack = localdom.getReducedDomainChangeStack(branchPositions);
    double tmpTreeWeight = nodequeue.emplaceNode(
        std::move(domchgStack), std::move(branchPositions),
        std::max(nodestack.back().lower_bound,
                 localdom.getObjectiveLowerBound()),
        nodestack.back().estimate, getCurrentDepth());
    if (countTreeWeight) treeweight += tmpTreeWeight;
  } else {
    mipsolver.mipdata_->debugSolution.nodePruned(localdom);
    if (countTreeWeight) treeweight += std::ldexp(1.0, 1 - getCurrentDepth());
  }
  nodestack.back().opensubtrees = 0;
}